

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::STEP::EXPRESS::LIST> __thiscall
Assimp::STEP::EXPRESS::LIST::Parse(LIST *this,char **inout,uint64_t line,ConversionSchema *schema)

{
  char *this_00;
  element_type *peVar1;
  SyntaxError *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool bVar3;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> sVar4;
  allocator<char> local_e9;
  string local_e8;
  value_type local_c8;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0;
  char *local_90;
  char *c;
  size_t count;
  allocator<char> local_69;
  string local_68;
  char *local_48;
  char *cur;
  MemberList *members;
  shared_ptr<Assimp::STEP::EXPRESS::LIST> list;
  ConversionSchema *schema_local;
  uint64_t line_local;
  char **inout_local;
  
  list.super___shared_ptr<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)schema;
  std::make_shared<Assimp::STEP::EXPRESS::LIST>();
  peVar1 = std::
           __shared_ptr_access<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&members);
  cur = (char *)&peVar1->members;
  local_48 = *inout + 1;
  if (**inout != '(') {
    count._3_1_ = 1;
    pSVar2 = (SyntaxError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"unexpected token, expected \'(\' token at beginning of list",
               &local_69);
    SyntaxError::SyntaxError(pSVar2,&local_68,line);
    count._3_1_ = 0;
    __cxa_throw(pSVar2,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  c = (char *)0x1;
  local_90 = local_48;
  while( true ) {
    bVar3 = false;
    if (*local_90 != '\0') {
      bVar3 = *local_90 != ')';
    }
    if (!bVar3) break;
    c = c + (int)(uint)(*local_90 == ',');
    local_90 = local_90 + 1;
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::reserve((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)cur,(size_type)c);
  while( true ) {
    if (*local_48 == '\0') {
      local_b2 = 1;
      pSVar2 = (SyntaxError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"unexpected end of line while reading list",&local_b1);
      SyntaxError::SyntaxError(pSVar2,&local_b0,0xffffffffffffffff);
      local_b2 = 0;
      __cxa_throw(pSVar2,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    SkipSpaces<char>(local_48,&local_48);
    this_00 = cur;
    if (*local_48 == ')') break;
    DataType::Parse((DataType *)&local_c8,&local_48,line,
                    (ConversionSchema *)
                    list.super___shared_ptr<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
    std::
    vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
    ::push_back((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 *)this_00,&local_c8);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr(&local_c8);
    SkipSpaces<char>(local_48,&local_48);
    if (*local_48 != ',') {
      if (*local_48 != ')') {
        pSVar2 = (SyntaxError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,
                   "unexpected token, expected \',\' or \')\' token after list element",&local_e9);
        SyntaxError::SyntaxError(pSVar2,&local_e8,line);
        __cxa_throw(pSVar2,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      break;
    }
    local_48 = local_48 + 1;
  }
  *inout = local_48 + 1;
  std::shared_ptr<Assimp::STEP::EXPRESS::LIST_const>::shared_ptr<Assimp::STEP::EXPRESS::LIST,void>
            ((shared_ptr<Assimp::STEP::EXPRESS::LIST_const> *)this,
             (shared_ptr<Assimp::STEP::EXPRESS::LIST> *)&members);
  std::shared_ptr<Assimp::STEP::EXPRESS::LIST>::~shared_ptr
            ((shared_ptr<Assimp::STEP::EXPRESS::LIST> *)&members);
  sVar4.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<const_Assimp::STEP::EXPRESS::LIST>)
         sVar4.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const EXPRESS::LIST> EXPRESS::LIST::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/) {
    const std::shared_ptr<EXPRESS::LIST> list = std::make_shared<EXPRESS::LIST>();
    EXPRESS::LIST::MemberList& members = list->members;

    const char* cur = inout;
    if (*cur++ != '(') {
        throw STEP::SyntaxError("unexpected token, expected \'(\' token at beginning of list",line);
    }

    // estimate the number of items upfront - lists can grow large
    size_t count = 1;
    for(const char* c=cur; *c && *c != ')'; ++c) {
        count += (*c == ',' ? 1 : 0);
    }

    members.reserve(count);

    for(;;++cur) {
        if (!*cur) {
            throw STEP::SyntaxError("unexpected end of line while reading list");
        }
        SkipSpaces(cur,&cur);
        if (*cur == ')') {
            break;
        }

        members.push_back( EXPRESS::DataType::Parse(cur,line,schema));
        SkipSpaces(cur,&cur);

        if (*cur != ',') {
            if (*cur == ')') {
                break;
            }
            throw STEP::SyntaxError("unexpected token, expected \',\' or \')\' token after list element",line);
        }
    }

    inout = cur+1;
    return list;
}